

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
userDefinedUnits_fileOp2_Test::~userDefinedUnits_fileOp2_Test(userDefinedUnits_fileOp2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, fileOp2)
{
    auto outputstr = definedUnitsFromFile(
        TEST_FILE_FOLDER "/test_unit_files/other_units2.txt");
    EXPECT_TRUE(outputstr.empty());
    auto y1 = unit_from_string("yodles");
    EXPECT_EQ(y1, precise_unit(73.0, count));

    auto y2 = unit_from_string("yeedles");
    EXPECT_EQ(y2, precise_unit(19.0, y1));
    auto y3 = unit_from_string("yimdles");
    EXPECT_EQ(y3, precise_unit(12.0, y2));
    EXPECT_EQ(unit_from_string("yimdles"), unit_from_string("19*yodles*12"));
    clearUserDefinedUnits();
}